

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# futex_test.cpp
# Opt level: O3

void * looper(void *param_1)

{
  int iVar1;
  int iVar2;
  ulong in_RAX;
  uint i;
  int iVar3;
  bool bVar4;
  
  iVar3 = 0;
  do {
    LOCK();
    bVar4 = lock == 0;
    iVar1 = lock;
    if (bVar4) {
      lock = 1;
      iVar1 = 0;
    }
    UNLOCK();
    iVar2 = lock;
    while (!bVar4) {
      lock = iVar2;
      if (iVar1 == 2) {
LAB_00101200:
        in_RAX = in_RAX & 0xffffffff00000000;
        syscall(0xca,&lock,0,2,0,0,in_RAX);
      }
      else {
        LOCK();
        if (iVar2 == 1) {
          lock = 2;
          iVar2 = 1;
        }
        UNLOCK();
        if (iVar2 != 0) goto LAB_00101200;
      }
      LOCK();
      bVar4 = lock == 0;
      iVar1 = lock;
      if (bVar4) {
        lock = 2;
        iVar1 = 0;
      }
      UNLOCK();
      iVar2 = lock;
    }
    global_variable = global_variable + 1;
    LOCK();
    lock = iVar2 + -1;
    UNLOCK();
    if (iVar2 == 2) {
      LOCK();
      lock = 0;
      UNLOCK();
      in_RAX = in_RAX & 0xffffffff00000000;
      syscall(0xca,&lock,1,1,0,0,in_RAX);
    }
    iVar3 = iVar3 + 1;
    if (iVar3 == 100000) {
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

static void *looper(void *)
{
	for (unsigned i = 0; i < num_iterations; i++)
	{
		Fossilize::futex_wrapper_lock(&lock);
		global_variable++;
		Fossilize::futex_wrapper_unlock(&lock);
	}
	return nullptr;
}